

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  ulong uVar6;
  runtime_error *prVar7;
  bar_base *pbVar8;
  long in_RSI;
  int in_EDI;
  exception *e;
  ostringstream oss_35;
  ostringstream oss_34;
  ostringstream oss_33;
  ostringstream oss_32;
  ostringstream oss_31;
  ostringstream oss_30;
  service srv_1;
  ostringstream oss_29;
  ostringstream oss_28;
  ostringstream oss_27;
  ostringstream oss_26;
  scope sc_2;
  ostringstream oss_25;
  ostringstream oss_24;
  ostringstream oss_23;
  scope sc_1;
  ostringstream oss_22;
  ostringstream oss_21;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  service srv;
  ostringstream oss_17;
  cppcms_error *anon_var_0;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  iterator p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  string msg;
  signature_error *e_1;
  ostringstream oss_4;
  ostringstream oss_3;
  bar_base *b;
  ostringstream oss_2;
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  cb;
  ostringstream oss_1;
  ostringstream oss;
  scope sc;
  value params;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb138;
  value *in_stack_ffffffffffffb140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb150;
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffb158;
  string *in_stack_ffffffffffffb398;
  string *in_stack_ffffffffffffb3a0;
  manager *in_stack_ffffffffffffb3a8;
  string *in_stack_ffffffffffffb3b0;
  manager *in_stack_ffffffffffffb3b8;
  string local_b20 [32];
  ostringstream local_b00 [383];
  allocator local_981;
  string local_980 [39];
  allocator local_959;
  string local_958 [47];
  undefined1 local_929;
  string local_928 [32];
  ostringstream local_908 [383];
  allocator local_789;
  string local_788 [39];
  allocator local_761;
  string local_760 [39];
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [40];
  bar_base *local_6e8;
  undefined1 local_6d9;
  string local_6d8 [32];
  ostringstream local_6b8 [383];
  allocator local_539;
  string local_538 [32];
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [55];
  undefined1 local_491;
  string local_490 [32];
  ostringstream local_470 [383];
  allocator local_2f1;
  string local_2f0 [39];
  undefined1 local_2c9;
  string local_2c8 [32];
  ostringstream local_2a8 [383];
  allocator local_129;
  string local_128 [32];
  scope local_108 [15];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [47];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [40];
  value local_50 [3];
  allocator local_31;
  string local_30 [44];
  undefined4 local_4;
  
  local_4 = 0;
  if (in_EDI != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage plugin_test /path/to/the/plugin/dir");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    return 1;
  }
  pcVar1 = *(char **)(in_RSI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cppcms::json::value::value((value *)0x10967f);
  cppcms::json::value::value<std::__cxx11::string>
            (in_stack_ffffffffffffb140,in_stack_ffffffffffffb138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"plugin",&local_79);
  psVar5 = (string *)cppcms::json::value::operator[]((string *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"paths",&local_a1);
  uVar6 = cppcms::json::value::operator[](psVar5);
  cppcms::json::value::operator[](uVar6);
  cppcms::json::value::operator=
            ((value *)in_stack_ffffffffffffb130,(value *)in_stack_ffffffffffffb128);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cppcms::json::value::~value((value *)0x1097af);
  cppcms::json::value::value<char[7]>
            (in_stack_ffffffffffffb140,(char (*) [7])in_stack_ffffffffffffb138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"plugin",&local_d1);
  psVar5 = (string *)cppcms::json::value::operator[]((string *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"modules",&local_f9);
  uVar6 = cppcms::json::value::operator[](psVar5);
  cppcms::json::value::operator[](uVar6);
  cppcms::json::value::operator=
            ((value *)in_stack_ffffffffffffb130,(value *)in_stack_ffffffffffffb128);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  cppcms::json::value::~value((value *)0x1098dc);
  cppcms::plugin::scope::scope(local_108,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"plugin",&local_129);
  bVar2 = cppcms::plugin::scope::is_loaded_by_this_scope((string *)local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_2a8);
    poVar4 = std::operator<<((ostream *)local_2a8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1a);
    std::operator<<(poVar4," sc.is_loaded_by_this_scope(\"plugin\")");
    local_2c9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2c8);
    local_2c9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"plugin",&local_2f1);
  bVar2 = cppcms::plugin::scope::is_loaded(local_2f0);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_470);
    poVar4 = std::operator<<((ostream *)local_470,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1b);
    std::operator<<(poVar4," cppcms::plugin::scope::is_loaded(\"plugin\")");
    local_491 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_490);
    local_491 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"- Normal call");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  booster::
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::callback((callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)0x109f8a);
  cppcms::plugin::manager::instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"foo",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"lower",&local_4f1);
  cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string_const&)>
            (in_stack_ffffffffffffb3b8,in_stack_ffffffffffffb3b0,(string *)in_stack_ffffffffffffb3a8
            );
  booster::
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=((callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)in_stack_ffffffffffffb130,
              (callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)in_stack_ffffffffffffb128);
  booster::
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~callback((callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x10a04c);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"Hello World",&local_539);
  booster::
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(in_stack_ffffffffffffb158,in_stack_ffffffffffffb150);
  bVar3 = std::operator==(in_stack_ffffffffffffb130,(char *)in_stack_ffffffffffffb128);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_6b8);
    poVar4 = std::operator<<((ostream *)local_6b8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x20);
    std::operator<<(poVar4," cb(\"Hello World\")==\"hello world\"");
    local_6d9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_6d8);
    local_6d9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::plugin::manager::instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_710,"foo",&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_738,"bar::create",&local_739);
  cppcms::plugin::manager::entry<bar_base*(std::__cxx11::string_const&)>
            (in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,in_stack_ffffffffffffb398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"hello",&local_761);
  pbVar8 = booster::
           callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()((callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)in_stack_ffffffffffffb150,in_stack_ffffffffffffb148);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  booster::
  callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~callback((callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x10a4e6);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  local_6e8 = pbVar8;
  (*(code *)**(undefined8 **)pbVar8)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_788,"hello",&local_789);
  bVar3 = std::operator==((char *)in_stack_ffffffffffffb130,in_stack_ffffffffffffb128);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_908);
    poVar4 = std::operator<<((ostream *)local_908,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x22);
    std::operator<<(poVar4," b->msg() == std::string(\"hello\")");
    local_929 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_928);
    local_929 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_6e8 != (bar_base *)0x0) {
    (**(code **)(*(long *)local_6e8 + 0x10))();
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"- Bad signature");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  cppcms::plugin::manager::instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"foo",&local_959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,"lower",&local_981);
  cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string&)>
            (in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,in_stack_ffffffffffffb398);
  booster::
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~callback((callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x10a961);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  std::__cxx11::ostringstream::ostringstream(local_b00);
  poVar4 = std::operator<<((ostream *)local_b00,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x27);
  std::operator<<(poVar4," !\"Never Get There\"");
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar7,local_b20);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc,char **argv)
{
	if(argc!=2) {
		std::cerr << "Usage plugin_test /path/to/the/plugin/dir" << std::endl;
		return 1;
	}
	std::string path = argv[1];
	cppcms::json::value params;

	params["plugin"]["paths"][0]=path;
	params["plugin"]["modules"][0]="plugin";

	try {
		using cppcms::plugin::manager;
		{
			cppcms::plugin::scope sc(params);
			TEST(sc.is_loaded_by_this_scope("plugin"));
			TEST(cppcms::plugin::scope::is_loaded("plugin"));

			std::cout << "- Normal call" << std::endl;
			booster::callback<std::string(std::string const &)> cb;
			cb = manager::instance().entry<std::string(std::string const &)>("foo","lower");
			TEST(cb("Hello World")=="hello world");
			bar_base *b=manager::instance().entry<bar_base *(std::string const &)>("foo","bar::create")("hello");
			TEST(b->msg() == std::string("hello"));
			delete b;
			try {
				std::cout << "- Bad signature" << std::endl;
				manager::instance().entry<std::string(std::string &)>("foo","lower");
				TEST(!"Never Get There");
			}
			catch(cppcms::plugin::signature_error const &e) {
				std::string msg = e.what();
				TEST(msg.find("std::string(std::string const &)")!=std::string::npos);
			}
			catch(...) { throw std::runtime_error("Something else thrown"); }
			std::cout << "- Iteration" << std::endl;
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().plugins().size()==1);
			TEST(*manager::instance().plugins().begin()=="foo");
			TEST(manager::instance().entries("foo").size()==3);
			std::set<std::string> names = manager::instance().entries("foo");
			std::set<std::string>::iterator p=names.begin();
			TEST(*p++ == "bar::create");
			TEST(*p++ == "counter");
			TEST(*p++ == "lower");
			TEST(p==names.end());
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
		} 
		std::cout << "- Unload" << std::endl;
		TEST(!cppcms::plugin::scope::is_loaded("plugin"));
		try {
			manager::instance().entry<std::string(std::string const &)>("foo","lower");
			std::cerr << "Must Not get there:" << __LINE__<<std::endl;
			return 1;
		}
		catch(cppcms::cppcms_error const &) {}
		catch(...) { throw std::runtime_error("Something else thrown"); }
		TEST(cppcms::plugin::manager::instance().has_plugin("foo")==false);
		std::cout << "- Scope vs Service" << std::endl;
		{
			cppcms::service srv(params);
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
			TEST(srv.plugins().is_loaded_by_this_scope("plugin"));
			TEST(cppcms::plugin::scope::is_loaded("plugin"));
			{
				cppcms::plugin::scope sc(params);
				TEST(!sc.is_loaded_by_this_scope("plugin"));
				TEST(manager::instance().entry<int()>("foo","counter")()==3);
			}
			TEST(manager::instance().entry<int()>("foo","counter")()==4);
		}
		{
			cppcms::plugin::scope sc(params);
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
			TEST(cppcms::plugin::scope::is_loaded("plugin"));
			{
				cppcms::service srv(params);
				TEST(!srv.plugins().is_loaded_by_this_scope("plugin"));
				TEST(sc.is_loaded_by_this_scope("plugin"));
				TEST(manager::instance().entry<int()>("foo","counter")()==3);
			}
			TEST(manager::instance().entry<int()>("foo","counter")()==4);
		}
		TEST(!manager::instance().has_plugin("foo"));
		TEST(!cppcms::plugin::scope::is_loaded("plugin"));
	}
	catch(std::exception const &e) {
		std::cerr << "Error:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}